

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_meshb_geom_bcast
          (REF_GEOM ref_geom,REF_LONG ngeom,REF_INT type,REF_NODE ref_node,REF_INT version,
          FILE *file)

{
  long *plVar1;
  void *pvVar2;
  REF_STATUS RVar3;
  long lVar4;
  void *data;
  void *pvVar5;
  REF_DBL *data_00;
  undefined8 uVar6;
  size_t sVar7;
  REF_DBL *pRVar8;
  ulong uVar9;
  REF_MPI ref_mpi;
  char *pcVar10;
  uint uVar11;
  REF_INT RVar12;
  REF_DBL *pRVar13;
  ulong uVar14;
  FILE *file_00;
  REF_INT local;
  REF_INT new_geom;
  REF_DBL double_gref;
  int local_ac;
  REF_DBL *local_a8;
  FILE *local_a0;
  void *local_98;
  REF_MPI local_90;
  REF_INT local_84;
  uint local_80;
  int local_7c;
  REF_LONG *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  REF_NODE local_48;
  REF_LONG local_40;
  double local_38;
  
  local_90 = ref_node->ref_mpi;
  lVar4 = ngeom / (long)local_90->n;
  local_68 = (ulong)(int)lVar4;
  if (lVar4 < 1000000) {
    local_68 = 1000000;
  }
  if (ngeom <= (long)local_68) {
    local_68 = ngeom;
  }
  if ((int)(uint)local_68 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x160,
           "ref_part_meshb_geom_bcast","malloc read_node of REF_LONG negative");
LAB_001cc71b:
    RVar3 = 1;
  }
  else {
    sVar7 = (ulong)((uint)local_68 & 0x7fffffff) << 3;
    data = malloc(sVar7);
    if (data == (void *)0x0) {
      pcVar10 = "malloc read_node of REF_LONG NULL";
      uVar6 = 0x160;
    }
    else {
      pvVar5 = malloc(sVar7);
      if (pvVar5 == (void *)0x0) {
        pcVar10 = "malloc read_id of REF_LONG NULL";
        uVar6 = 0x161;
      }
      else {
        local_98 = pvVar5;
        pvVar5 = malloc(sVar7);
        uVar14 = local_68;
        if (pvVar5 == (void *)0x0) {
          pcVar10 = "malloc read_gref of REF_LONG NULL";
          uVar6 = 0x162;
        }
        else {
          data_00 = (REF_DBL *)malloc((ulong)((uint)local_68 & 0x7fffffff) << 4);
          if (data_00 != (REF_DBL *)0x0) {
            if (0 < ngeom) {
              local_58 = (ulong)(uint)type;
              lVar4 = 0;
              local_a0 = (FILE *)file;
              local_84 = version;
              do {
                uVar11 = (int)ngeom - (int)lVar4;
                local_70 = (ulong)uVar11;
                if ((int)uVar14 < (int)uVar11) {
                  local_70 = uVar14 & 0xffffffff;
                }
                ref_mpi = local_90;
                local_50 = lVar4;
                if ((local_90->id == 0) && (0 < (int)local_70)) {
                  uVar14 = 0;
                  file_00 = local_a0;
                  local_a8 = data_00;
                  local_60 = local_70;
                  do {
                    RVar12 = local_84;
                    RVar3 = ref_part_meshb_long((FILE *)file_00,local_84,
                                                (REF_LONG *)((long)data + uVar14 * 8));
                    if (RVar3 != 0) {
                      uVar6 = 0x16a;
LAB_001cc987:
                      uVar11 = 1;
                      pcVar10 = "node";
                      uVar14 = 1;
                      goto LAB_001cc92b;
                    }
                    local_78 = (REF_LONG *)((long)local_98 + uVar14 * 8);
                    RVar3 = ref_part_meshb_long((FILE *)file_00,RVar12,local_78);
                    if (RVar3 != 0) {
                      uVar6 = 0x16b;
                      goto LAB_001cc987;
                    }
                    data_00[uVar14 * 2] = 0.0;
                    (data_00 + uVar14 * 2)[1] = 0.0;
                    uVar9 = local_58;
                    pRVar13 = local_a8;
                    if (type < 1) {
                      *(REF_LONG *)((long)pvVar5 + uVar14 * 8) = *local_78;
                      ref_mpi = local_90;
                      file_00 = local_a0;
                    }
                    else {
                      do {
                        sVar7 = fread(pRVar13,8,1,local_a0);
                        ref_mpi = local_90;
                        file_00 = local_a0;
                        if (sVar7 != 1) {
                          pcVar10 = "param";
                          uVar6 = 0x170;
                          goto LAB_001cc82a;
                        }
                        pRVar13 = pRVar13 + 1;
                        uVar9 = uVar9 - 1;
                      } while (uVar9 != 0);
                      *(REF_LONG *)((long)pvVar5 + uVar14 * 8) = *local_78;
                      if (0 < type) {
                        sVar7 = fread(&local_38,8,1,local_a0);
                        if (sVar7 != 1) {
                          pcVar10 = "gref";
                          uVar6 = 0x173;
LAB_001cc82a:
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,uVar6,"ref_part_meshb_geom_bcast",pcVar10,1,sVar7);
                          goto LAB_001cc71b;
                        }
                        *(long *)((long)pvVar5 + uVar14 * 8) = (long)local_38;
                      }
                    }
                    uVar14 = uVar14 + 1;
                    local_a8 = local_a8 + 2;
                  } while (uVar14 != local_60);
                  if (0 < (int)local_70) {
                    uVar14 = 0;
                    do {
                      plVar1 = (long *)((long)data + uVar14 * 8);
                      *plVar1 = *plVar1 + -1;
                      uVar14 = uVar14 + 1;
                    } while (local_60 != uVar14);
                  }
                }
                uVar14 = local_70;
                RVar12 = (REF_INT)local_70;
                uVar11 = ref_mpi_bcast(ref_mpi,data,RVar12,2);
                if (uVar11 != 0) {
                  pcVar10 = "nd";
                  uVar6 = 0x179;
LAB_001cc928:
                  uVar14 = (ulong)uVar11;
LAB_001cc92b:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar6,"ref_part_meshb_geom_bcast",uVar14,pcVar10);
                  return uVar11;
                }
                uVar11 = ref_mpi_bcast(ref_mpi,local_98,RVar12,2);
                if (uVar11 != 0) {
                  pcVar10 = "id";
                  uVar6 = 0x17a;
                  goto LAB_001cc928;
                }
                uVar11 = ref_mpi_bcast(ref_mpi,pvVar5,RVar12,2);
                if (uVar11 != 0) {
                  pcVar10 = "gref";
                  uVar6 = 0x17b;
                  goto LAB_001cc928;
                }
                uVar11 = ref_mpi_bcast(ref_mpi,data_00,RVar12 * 2,3);
                if (uVar11 != 0) {
                  pcVar10 = "pm";
                  uVar6 = 0x17d;
                  goto LAB_001cc928;
                }
                if (0 < RVar12) {
                  local_a8 = (REF_DBL *)(uVar14 & 0xffffffff);
                  pRVar8 = (REF_DBL *)0x0;
                  pRVar13 = data_00;
                  local_48 = ref_node;
                  local_40 = ngeom;
                  do {
                    uVar11 = ref_node_local(ref_node,*(REF_GLOB *)((long)data + (long)pRVar8 * 8),
                                            &local_ac);
                    if ((uVar11 != 0) && (uVar11 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x180,"ref_part_meshb_geom_bcast",(ulong)uVar11,"local");
                      local_80 = uVar11;
                    }
                    pvVar2 = local_98;
                    if ((uVar11 != 5) && (uVar11 != 0)) {
                      return local_80;
                    }
                    if (local_ac != -1) {
                      uVar11 = ref_geom_add(ref_geom,local_ac,type,
                                            *(REF_INT *)((long)local_98 + (long)pRVar8 * 8),pRVar13)
                      ;
                      if (uVar11 != 0) {
                        pcVar10 = "add geom";
                        uVar6 = 0x184;
                        goto LAB_001cc928;
                      }
                      uVar11 = ref_geom_find(ref_geom,local_ac,type,
                                             *(REF_INT *)((long)pvVar2 + (long)pRVar8 * 8),&local_7c
                                            );
                      if (uVar11 != 0) {
                        pcVar10 = "find";
                        uVar6 = 0x187;
                        goto LAB_001cc928;
                      }
                      ref_geom->descr[(long)local_7c * 6 + 2] =
                           *(REF_INT *)((long)pvVar5 + (long)pRVar8 * 8);
                      ngeom = local_40;
                      ref_node = local_48;
                    }
                    pRVar8 = (REF_DBL *)((long)pRVar8 + 1);
                    pRVar13 = pRVar13 + 2;
                  } while (local_a8 != pRVar8);
                }
                lVar4 = local_50 + (int)local_70;
                uVar14 = local_68;
              } while (lVar4 < ngeom);
            }
            free(data_00);
            free(pvVar5);
            free(local_98);
            free(data);
            return 0;
          }
          pcVar10 = "malloc read_param of REF_DBL NULL";
          uVar6 = 0x163;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar6,
           "ref_part_meshb_geom_bcast",pcVar10);
    RVar3 = 2;
  }
  return RVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_geom_bcast(
    REF_GEOM ref_geom, REF_LONG ngeom, REF_INT type, REF_NODE ref_node,
    REF_INT version, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_LONG *read_node;
  REF_LONG *read_id;
  REF_LONG *read_gref;
  REF_DBL *read_param;
  REF_DBL double_gref;

  REF_LONG ngeom_read;
  REF_INT section_size;

  REF_INT geom, new_geom;
  REF_INT i, local;

  chunk = (REF_INT)MAX(1000000, ngeom / (REF_LONG)ref_mpi_n(ref_mpi));
  chunk = (REF_INT)MIN((REF_LONG)chunk, ngeom);

  ref_malloc(read_node, chunk, REF_LONG);
  ref_malloc(read_id, chunk, REF_LONG);
  ref_malloc(read_gref, chunk, REF_LONG);
  ref_malloc(read_param, 2 * chunk, REF_DBL);

  ngeom_read = 0;
  while (ngeom_read < ngeom) {
    section_size = MIN(chunk, (REF_INT)(ngeom - ngeom_read));
    if (ref_mpi_once(ref_mpi)) {
      for (geom = 0; geom < section_size; geom++) {
        RSS(ref_part_meshb_long(file, version, &(read_node[geom])), "node");
        RSS(ref_part_meshb_long(file, version, &(read_id[geom])), "node");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_LONG)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;
    }
    RSS(ref_mpi_bcast(ref_mpi, read_node, section_size, REF_LONG_TYPE), "nd");
    RSS(ref_mpi_bcast(ref_mpi, read_id, section_size, REF_LONG_TYPE), "id");
    RSS(ref_mpi_bcast(ref_mpi, read_gref, section_size, REF_LONG_TYPE), "gref");
    RSS(ref_mpi_bcast(ref_mpi, read_param, 2 * section_size, REF_DBL_TYPE),
        "pm");
    for (geom = 0; geom < section_size; geom++) {
      RXS(ref_node_local(ref_node, read_node[geom], &local), REF_NOT_FOUND,
          "local");
      if (REF_EMPTY != local) {
        RSS(ref_geom_add(ref_geom, local, type, (REF_INT)read_id[geom],
                         &(read_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, local, type, (REF_INT)read_id[geom],
                          &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = (REF_INT)read_gref[geom];
      }
    }
    ngeom_read += section_size;
  }

  ref_free(read_param);
  ref_free(read_gref);
  ref_free(read_id);
  ref_free(read_node);

  return REF_SUCCESS;
}